

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_ast_eq(mpc_ast_t *a,mpc_ast_t *b)

{
  int iVar1;
  int local_24;
  int i;
  mpc_ast_t *b_local;
  mpc_ast_t *a_local;
  
  iVar1 = strcmp(a->tag,b->tag);
  if (iVar1 == 0) {
    iVar1 = strcmp(a->contents,b->contents);
    if (iVar1 == 0) {
      if (a->children_num == b->children_num) {
        for (local_24 = 0; local_24 < a->children_num; local_24 = local_24 + 1) {
          iVar1 = mpc_ast_eq(a->children[local_24],b->children[local_24]);
          if (iVar1 == 0) {
            return 0;
          }
        }
        a_local._4_4_ = 1;
      }
      else {
        a_local._4_4_ = 0;
      }
    }
    else {
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int mpc_ast_eq(mpc_ast_t *a, mpc_ast_t *b) {

  int i;

  if (strcmp(a->tag, b->tag) != 0) { return 0; }
  if (strcmp(a->contents, b->contents) != 0) { return 0; }
  if (a->children_num != b->children_num) { return 0; }

  for (i = 0; i < a->children_num; i++) {
    if (!mpc_ast_eq(a->children[i], b->children[i])) { return 0; }
  }

  return 1;
}